

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ExprNodeTest_TERM(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  int iVar1;
  Fts5ExprPhrase *pFVar2;
  Fts5IndexIter *pFVar3;
  
  pFVar2 = pNode->pNear->apPhrase[0];
  pFVar3 = pFVar2->aTerm[0].pIter;
  iVar1 = pFVar3->nData;
  (pFVar2->poslist).n = iVar1;
  if (pExpr->pConfig->eDetail == 0) {
    (pFVar2->poslist).p = pFVar3->pData;
  }
  pNode->iRowid = pFVar3->iRowid;
  pNode->bNomatch = (uint)(iVar1 == 0);
  return iVar1;
}

Assistant:

static int fts5ExprNodeTest_TERM(
  Fts5Expr *pExpr,                /* Expression that pNear is a part of */
  Fts5ExprNode *pNode             /* The "NEAR" node (FTS5_TERM) */
){
  /* As this "NEAR" object is actually a single phrase that consists 
  ** of a single term only, grab pointers into the poslist managed by the
  ** fts5_index.c iterator object. This is much faster than synthesizing 
  ** a new poslist the way we have to for more complicated phrase or NEAR
  ** expressions.  */
  Fts5ExprPhrase *pPhrase = pNode->pNear->apPhrase[0];
  Fts5IndexIter *pIter = pPhrase->aTerm[0].pIter;

  assert( pNode->eType==FTS5_TERM );
  assert( pNode->pNear->nPhrase==1 && pPhrase->nTerm==1 );
  assert( pPhrase->aTerm[0].pSynonym==0 );

  pPhrase->poslist.n = pIter->nData;
  if( pExpr->pConfig->eDetail==FTS5_DETAIL_FULL ){
    pPhrase->poslist.p = (u8*)pIter->pData;
  }
  pNode->iRowid = pIter->iRowid;
  pNode->bNomatch = (pPhrase->poslist.n==0);
  return SQLITE_OK;
}